

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

value_type * __thiscall
nonstd::optional_lite::optional<tinyusdz::APISchemas>::value(optional<tinyusdz::APISchemas> *this)

{
  bool bVar1;
  value_type *pvVar2;
  optional<tinyusdz::APISchemas> *this_local;
  
  bVar1 = has_value(this);
  if (!bVar1) {
    __assert_fail("has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                  ,0x584,
                  "const value_type &nonstd::optional_lite::optional<tinyusdz::APISchemas>::value() const [T = tinyusdz::APISchemas]"
                 );
  }
  pvVar2 = detail::storage_t<tinyusdz::APISchemas>::value
                     ((storage_t<tinyusdz::APISchemas> *)&this->contained);
  return pvVar2;
}

Assistant:

optional_constexpr14 value_type const & value() const optional_ref_qual
    {
#if optional_CONFIG_NO_EXCEPTIONS
        assert( has_value() );
#else
        if ( ! has_value() )
        {
            throw bad_optional_access();
        }
#endif
        return contained.value();
    }